

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_task_manager.hpp
# Opt level: O3

unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true> __thiscall
duckdb::BatchTaskManager<duckdb::BatchInsertTask>::GetTask
          (BatchTaskManager<duckdb::BatchInsertTask> *this)

{
  long *plVar1;
  int iVar2;
  pthread_mutex_t *in_RSI;
  long lVar3;
  
  iVar2 = pthread_mutex_lock(in_RSI);
  if (iVar2 == 0) {
    plVar1 = *(long **)((long)in_RSI + 0x38);
    if (*(long **)((long)in_RSI + 0x58) == plVar1) {
      lVar3 = 0;
    }
    else {
      lVar3 = *plVar1;
      *plVar1 = 0;
      ::std::
      deque<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
      ::pop_front((deque<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
                   *)&in_RSI[1].__data);
    }
    (this->task_lock).super___mutex_base._M_mutex.__align = lVar3;
    pthread_mutex_unlock(in_RSI);
    return (unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>_>)
           (unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>_>)this;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

unique_ptr<TASK> GetTask() {
		lock_guard<mutex> l(task_lock);
		if (task_queue.empty()) {
			return nullptr;
		}
		auto entry = std::move(task_queue.front());
		task_queue.pop();
		return entry;
	}